

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack4_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x10 | *out;
  *out = (in[2] - base) * 0x100 | *out;
  *out = (in[3] - base) * 0x1000 | *out;
  *out = (in[4] - base) * 0x10000 | *out;
  *out = (in[5] - base) * 0x100000 | *out;
  *out = (in[6] - base) * 0x1000000 | *out;
  *out = (in[7] - base) * 0x10000000 | *out;
  return out + 1;
}

Assistant:

uint32_t * pack4_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    ++in;

    return out;
}